

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int RGBE_to_RGBdivA2(uchar *image,int width,int height,int rescale_to_max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  int local_78;
  int local_74;
  int local_70;
  byte local_6c;
  int local_68;
  float local_64;
  float local_60;
  float local_5c;
  float m;
  float e;
  float b;
  float g;
  float r;
  float scale;
  uchar *img;
  int local_28;
  int iv;
  int i;
  int rescale_to_max_local;
  int height_local;
  int width_local;
  uchar *image_local;
  
  g = 1.0;
  if (((image == (uchar *)0x0) || (width < 1)) || (height < 1)) {
    image_local._4_4_ = 0;
  }
  else {
    if (rescale_to_max != 0) {
      fVar1 = find_max_RGBE(image,width,height);
      g = 65025.0 / fVar1;
    }
    _r = image;
    for (local_28 = width * height; 0 < local_28; local_28 = local_28 + -1) {
      dVar5 = ldexp(0.003921568859368563,_r[3] - 0x80);
      fVar2 = (float)((double)g * dVar5);
      fVar1 = fVar2 * (float)*_r;
      fVar3 = fVar2 * (float)_r[1];
      fVar2 = fVar2 * (float)_r[2];
      local_5c = fVar3;
      if (fVar3 < fVar1) {
        local_5c = fVar1;
      }
      local_60 = fVar2;
      if (fVar2 <= local_5c) {
        local_60 = local_5c;
      }
      if ((local_60 != 0.0) || (NAN(local_60))) {
        fVar4 = sqrtf(65025.0 / local_60);
        local_64 = (float)(int)fVar4;
      }
      else {
        local_64 = 1.0;
      }
      local_68 = (int)local_64;
      if (local_68 < 1) {
        local_68 = 1;
      }
      if (local_68 < 0x100) {
        local_6c = (byte)local_68;
      }
      else {
        local_6c = 0xff;
      }
      _r[3] = local_6c;
      local_70 = (int)(((float)((uint)_r[3] * (uint)_r[3]) * fVar1) / 255.0 + 0.5);
      if (0xff < local_70) {
        local_70 = 0xff;
      }
      *_r = (byte)local_70;
      local_74 = (int)(((float)((uint)_r[3] * (uint)_r[3]) * fVar3) / 255.0 + 0.5);
      if (0xff < local_74) {
        local_74 = 0xff;
      }
      _r[1] = (byte)local_74;
      local_78 = (int)(((float)((uint)_r[3] * (uint)_r[3]) * fVar2) / 255.0 + 0.5);
      if (0xff < local_78) {
        local_78 = 0xff;
      }
      _r[2] = (byte)local_78;
      _r = _r + 4;
    }
    image_local._4_4_ = 1;
  }
  return image_local._4_4_;
}

Assistant:

int
RGBE_to_RGBdivA2
(
    unsigned char *image,
    int width, int height,
    int rescale_to_max
)
{
	/* local variables */
	int i, iv;
	unsigned char *img = image;
	float scale = 1.0f;
	/* error check */
	if( (!image) || (width < 1) || (height < 1) )
	{
		return 0;
	}
	/* convert (note: no negative numbers, but 0.0 is possible) */
	if( rescale_to_max )
	{
		scale = 255.0f * 255.0f / find_max_RGBE( image, width, height );
	}
	for( i = width * height; i > 0; --i )
	{
		/* decode this pixel, and find the max */
		float r,g,b,e, m;
		/* e = scale * powf( 2.0f, img[3] - 128.0f ) / 255.0f; */
		e = scale * ldexp( 1.0f / 255.0f, (int)(img[3]) - 128 );
		r = e * img[0];
		g = e * img[1];
		b = e * img[2];
		m = (r > g) ? r : g;
		m = (b > m) ? b : m;
		/* and encode it into RGBdivA */
		iv = (m != 0.0f) ? (int)sqrtf( 255.0f * 255.0f / m ) : 1.0f;
		iv = (iv < 1) ? 1 : iv;
		img[3] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * r / 255.0f + 0.5f);
		img[0] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * g / 255.0f + 0.5f);
		img[1] = (iv > 255) ? 255 : iv;
		iv = (int)(img[3] * img[3] * b / 255.0f + 0.5f);
		img[2] = (iv > 255) ? 255 : iv;
		/* and on to the next pixel */
		img += 4;
	}
	return 1;
}